

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetFrameTimestampsTests.cpp
# Opt level: O0

EGLContext
deqp::egl::anon_unknown_1::createGLES2Context(Library *egl,EGLDisplay display,EGLConfig config)

{
  deUint32 dVar1;
  deBool dVar2;
  EGLint extraout_var;
  TestError *this;
  undefined8 local_34;
  EGLint attribList [3];
  EGLContext context;
  EGLConfig config_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  attribList[1] = 0;
  attribList[2] = 0;
  local_34 = 0x200003098;
  attribList[0] = 0x3038;
  do {
    (**egl->_vptr_Library)(egl,0x30a0);
    dVar1 = (*egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"bindAPI(EGL_OPENGL_ES_API)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                     ,0xec);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  attribList[1] = (*egl->_vptr_Library[6])(egl,display,config,0,&local_34);
  attribList[2] = extraout_var;
  dVar1 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar1,"eglCreateContext() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                   ,0xef);
  while( true ) {
    dVar2 = ::deGetFalse();
    if ((dVar2 != 0) || (attribList._4_8_ == 0)) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      return (EGLContext)attribList._4_8_;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"context",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
             ,0xf0);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

EGLContext createGLES2Context (const Library& egl, EGLDisplay display, EGLConfig config)
{
	EGLContext		context = EGL_NO_CONTEXT;
	const EGLint	attribList[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));

	context = egl.createContext(display, config, EGL_NO_CONTEXT, attribList);
	EGLU_CHECK_MSG(egl, "eglCreateContext() failed");
	TCU_CHECK(context);

	return context;
}